

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  cf_poly1305 *poly;
  uint8_t lenbuf [16];
  
  poly = &ctx->poly;
  chacha20poly1305_encrypt_pad(poly,ctx->textlen);
  lenbuf._0_8_ = ctx->aadlen;
  lenbuf._8_8_ = ctx->textlen;
  cf_poly1305_update(poly,lenbuf,0x10);
  cf_poly1305_finish(poly,tag);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(&ctx->poly, ctx->textlen);

    write64_le(ctx->aadlen, lenbuf);
    write64_le(ctx->textlen, lenbuf + 8);
    cf_poly1305_update(&ctx->poly, lenbuf, sizeof(lenbuf));

    cf_poly1305_finish(&ctx->poly, tag);
}